

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O2

void __thiscall
CRegexStack::swap(CRegexStack *this,int *start_ofs,int *str_ofs,size_t *curlen,re_state_id *state,
                 re_state_id *final,re_group_register_conflict *regs,short *loop_vars)

{
  short sVar1;
  int iVar2;
  re_group_register_conflict rVar3;
  size_t sVar4;
  long lVar5;
  int *piVar6;
  
  iVar2 = *str_ofs;
  piVar6 = (int *)(this->buf_ + (long)this->sp_ + 0x24);
  *str_ofs = piVar6[-7];
  piVar6[-7] = iVar2;
  iVar2 = *start_ofs;
  *start_ofs = piVar6[-8];
  piVar6[-8] = iVar2;
  sVar4 = *curlen;
  *curlen = (long)piVar6[-6];
  piVar6[-6] = (int)sVar4;
  iVar2 = *state;
  *state = piVar6[-5];
  piVar6[-5] = iVar2;
  iVar2 = *final;
  *final = piVar6[-4];
  piVar6[-4] = iVar2;
  for (; piVar6 < this->buf_ + this->used_; piVar6 = piVar6 + 3) {
    lVar5 = (long)*piVar6;
    if (lVar5 < 10) {
      rVar3 = regs[lVar5];
      regs[lVar5] = *(re_group_register_conflict *)(piVar6 + 1);
      *(re_group_register_conflict *)(piVar6 + 1) = rVar3;
    }
    else {
      sVar1 = loop_vars[lVar5 + -10];
      loop_vars[lVar5 + -10] = (short)piVar6[1];
      *(short *)(piVar6 + 1) = sVar1;
    }
  }
  return;
}

Assistant:

void swap(int *start_ofs, int *str_ofs, size_t *curlen,
              re_state_id *state, re_state_id *final,
              re_group_register *regs, short *loop_vars)
    {
        /* get the stack pointer */
        regex_stack_entry *fp = (regex_stack_entry *)(buf_ + sp_);

        /* swap the string offset */
        int tmp_ofs = *str_ofs;
        *str_ofs = fp->str_ofs;
        fp->str_ofs = tmp_ofs;

        /* swap the starting offset */
        tmp_ofs = *start_ofs;
        *start_ofs = fp->start_ofs;
        fp->start_ofs = tmp_ofs;

        /* swap the search length */
        size_t tmp_len = *curlen;
        *curlen = fp->curlen;
        fp->curlen = tmp_len;

        /* swap the current machine state */
        re_state_id tmp_id = *state;
        *state = fp->state;
        fp->state = tmp_id;

        /* swap the final machine state */
        tmp_id = *final;
        *final = fp->final;
        fp->final = tmp_id;

        /* swap all group and loop registers with the current state */
        for (regex_stack_var *var = (regex_stack_var *)(fp + 1) ;
             var < (regex_stack_var *)(buf_ + used_) ; ++var)
        {
            /* sense the type */
            if (var->id < RE_GROUP_REG_CNT)
            {
                re_group_register tmp;
                
                /* it's a group register */
                tmp = regs[var->id];
                regs[var->id] = var->val.group;
                var->val.group = tmp;
            }
            else
            {
                short tmp;
                
                /* it's a loop variable */
                tmp = loop_vars[var->id - RE_GROUP_REG_CNT];
                loop_vars[var->id - RE_GROUP_REG_CNT] = var->val.loopvar;
                var->val.loopvar = tmp;
            }
        }
    }